

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  Rep *pRVar4;
  
  pRVar4 = this->rep_;
  if ((pRVar4 != (Rep *)0x0) && (this->arena_ == (Arena *)0x0)) {
    iVar1 = pRVar4->allocated_size;
    if (0 < (long)iVar1) {
      lVar3 = 0;
      do {
        puVar2 = (undefined8 *)pRVar4->elements[lVar3];
        if ((puVar2 != (undefined8 *)0x0) && ((undefined8 *)*puVar2 != puVar2 + 2)) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
      pRVar4 = this->rep_;
    }
    operator_delete(pRVar4);
  }
  this->rep_ = (Rep *)0x0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::Destroy() {
  if (rep_ != NULL && arena_ == NULL) {
    int n = rep_->allocated_size;
    void* const* elements = rep_->elements;
    for (int i = 0; i < n; i++) {
      TypeHandler::Delete(cast<TypeHandler>(elements[i]), NULL);
    }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t size = total_size_ * sizeof(elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(rep_), size);
#else
    ::operator delete(static_cast<void*>(rep_));
#endif
  }
  rep_ = NULL;
}